

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity,char *filename)

{
  REF_INT RVar1;
  int iVar2;
  REF_GRID pRVar3;
  REF_CELL pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  FILE *__s;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  REF_STATUS RVar12;
  ulong uVar13;
  REF_DICT node_dict;
  REF_INT local;
  REF_DICT face_dict;
  long local_c0;
  REF_GRID local_b8;
  REF_INT local_ac;
  REF_INT nodes [27];
  
  pRVar3 = ref_cavity->ref_grid;
  RVar1 = ref_cavity->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x837,
           "ref_cavity_tec","unable to open file");
    RVar12 = 2;
  }
  else {
    fwrite("title=\"tecplot refine cavity\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"i\"\n",0x1c,1,__s);
    uVar6 = ref_dict_create(&node_dict);
    if (uVar6 == 0) {
      uVar6 = ref_dict_create(&face_dict);
      if (uVar6 == 0) {
        pRVar4 = pRVar3->cell[8];
        local_b8 = pRVar3;
        local_ac = RVar1;
        for (lVar11 = 0; lVar11 < ref_cavity->tet_list->n; lVar11 = lVar11 + 1) {
          RVar1 = ref_cavity->tet_list->value[lVar11];
          uVar6 = ref_dict_store(face_dict,RVar1,0);
          if (uVar6 != 0) {
            uVar13 = (ulong)uVar6;
            pcVar10 = "store";
            uVar7 = 0x842;
            goto LAB_001b9519;
          }
          uVar6 = ref_cell_nodes(pRVar4,RVar1,nodes);
          if (uVar6 != 0) {
            uVar13 = (ulong)uVar6;
            pcVar10 = "nodes";
            uVar7 = 0x843;
            goto LAB_001b9519;
          }
          lVar8 = 0;
          while (lVar8 < pRVar4->node_per) {
            uVar6 = ref_dict_store(node_dict,nodes[lVar8],0);
            lVar8 = lVar8 + 1;
            if (uVar6 != 0) {
              uVar13 = (ulong)uVar6;
              pcVar10 = "store";
              uVar7 = 0x845;
              goto LAB_001b9519;
            }
          }
        }
        if ((0 < node_dict->n) && (0 < face_dict->n)) {
          fprintf(__s,"zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)(uint)node_dict->n,(ulong)(uint)face_dict->n,"point","fetetrahedron");
          for (lVar11 = 0; lVar11 < node_dict->n; lVar11 = lVar11 + 1) {
            local = node_dict->key[lVar11];
            lVar8 = (long)local;
            pRVar5 = local_b8->node->real;
            fprintf(__s," %.16e %.16e %.16e %d\n",pRVar5[lVar8 * 0xf],pRVar5[lVar8 * 0xf + 1],
                    pRVar5[lVar8 * 0xf + 2]);
          }
          lVar11 = 0;
          while (lVar11 < face_dict->n) {
            local_c0 = lVar11;
            uVar6 = ref_cell_nodes(pRVar4,face_dict->key[lVar11],nodes);
            if (uVar6 != 0) {
              uVar13 = (ulong)uVar6;
              pcVar10 = "nodes";
              uVar7 = 0x859;
              goto LAB_001b9519;
            }
            for (lVar11 = 0; lVar11 < pRVar4->node_per; lVar11 = lVar11 + 1) {
              uVar6 = ref_dict_location(node_dict,nodes[lVar11],&local);
              if (uVar6 != 0) {
                uVar13 = (ulong)uVar6;
                pcVar10 = "ret";
                uVar7 = 0x85b;
                goto LAB_001b9519;
              }
              fprintf(__s," %d",(ulong)(local + 1));
            }
            fputc(10,__s);
            lVar11 = local_c0 + 1;
          }
        }
        uVar6 = ref_dict_free(face_dict);
        if (uVar6 == 0) {
          uVar6 = ref_dict_free(node_dict);
          if (uVar6 == 0) {
            uVar6 = ref_dict_create(&node_dict);
            if (uVar6 == 0) {
              uVar6 = ref_dict_create(&face_dict);
              if (uVar6 == 0) {
                uVar6 = ref_dict_store(node_dict,local_ac,0);
                if (uVar6 == 0) {
                  lVar8 = 0;
                  for (lVar11 = 0; lVar11 < ref_cavity->maxface; lVar11 = lVar11 + 1) {
                    if (ref_cavity->f2n[lVar11 * 3] != -1) {
                      uVar6 = ref_dict_store(face_dict,(REF_INT)lVar11,0);
                      if (uVar6 != 0) {
                        uVar13 = (ulong)uVar6;
                        pcVar10 = "store";
                        uVar7 = 0x869;
                        goto LAB_001b9519;
                      }
                      lVar9 = 0;
                      while (lVar9 != 3) {
                        uVar6 = ref_dict_store(node_dict,
                                               *(REF_INT *)
                                                ((long)ref_cavity->f2n + lVar9 * 4 + lVar8),0);
                        lVar9 = lVar9 + 1;
                        if (uVar6 != 0) {
                          uVar13 = (ulong)uVar6;
                          pcVar10 = "store";
                          uVar7 = 0x86d;
                          goto LAB_001b9519;
                        }
                      }
                    }
                    lVar8 = lVar8 + 0xc;
                  }
                  if ((0 < node_dict->n) && (0 < face_dict->n)) {
                    fprintf(__s,
                            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)(uint)node_dict->n,(ulong)(uint)face_dict->n,"point",
                            "fetetrahedron");
                    for (lVar11 = 0; lVar11 < node_dict->n; lVar11 = lVar11 + 1) {
                      local = node_dict->key[lVar11];
                      lVar8 = (long)local;
                      pRVar5 = local_b8->node->real;
                      fprintf(__s," %.16e %.16e %.16e %d\n",pRVar5[lVar8 * 0xf],
                              pRVar5[lVar8 * 0xf + 1],pRVar5[lVar8 * 0xf + 2]);
                    }
                    for (local_c0 = 0; local_c0 < face_dict->n; local_c0 = local_c0 + 1) {
                      iVar2 = face_dict->key[local_c0];
                      uVar6 = ref_dict_location(node_dict,local_ac,&local);
                      if (uVar6 != 0) {
                        uVar13 = (ulong)uVar6;
                        pcVar10 = "center node";
                        uVar7 = 0x881;
                        goto LAB_001b9519;
                      }
                      fprintf(__s," %d",(ulong)(local + 1));
                      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                        uVar6 = ref_dict_location(node_dict,ref_cavity->f2n[iVar2 * 3 + lVar11],
                                                  &local);
                        if (uVar6 != 0) {
                          uVar13 = (ulong)uVar6;
                          pcVar10 = "ret";
                          uVar7 = 0x886;
                          goto LAB_001b9519;
                        }
                        fprintf(__s," %d",(ulong)(local + 1));
                      }
                      fputc(10,__s);
                    }
                  }
                  uVar6 = ref_dict_free(face_dict);
                  if (uVar6 == 0) {
                    uVar6 = ref_dict_free(node_dict);
                    if (uVar6 == 0) {
                      uVar6 = ref_dict_create(&node_dict);
                      if (uVar6 == 0) {
                        uVar6 = ref_dict_create(&face_dict);
                        if (uVar6 == 0) {
                          pRVar4 = local_b8->cell[3];
                          for (lVar11 = 0; lVar11 < ref_cavity->tri_list->n; lVar11 = lVar11 + 1) {
                            RVar1 = ref_cavity->tri_list->value[lVar11];
                            uVar6 = ref_dict_store(face_dict,RVar1,0);
                            if (uVar6 != 0) {
                              uVar13 = (ulong)uVar6;
                              pcVar10 = "store";
                              uVar7 = 0x898;
                              goto LAB_001b9519;
                            }
                            uVar6 = ref_cell_nodes(pRVar4,RVar1,nodes);
                            if (uVar6 != 0) {
                              uVar13 = (ulong)uVar6;
                              pcVar10 = "nodes";
                              uVar7 = 0x899;
                              goto LAB_001b9519;
                            }
                            lVar8 = 0;
                            while (lVar8 < pRVar4->node_per) {
                              uVar6 = ref_dict_store(node_dict,nodes[lVar8],0);
                              lVar8 = lVar8 + 1;
                              if (uVar6 != 0) {
                                uVar13 = (ulong)uVar6;
                                pcVar10 = "store";
                                uVar7 = 0x89b;
                                goto LAB_001b9519;
                              }
                            }
                          }
                          if ((0 < node_dict->n) && (0 < face_dict->n)) {
                            fprintf(__s,
                                    "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                    ,(ulong)(uint)node_dict->n,(ulong)(uint)face_dict->n,"point",
                                    "fetriangle");
                            for (lVar11 = 0; lVar11 < node_dict->n; lVar11 = lVar11 + 1) {
                              local = node_dict->key[lVar11];
                              lVar8 = (long)local;
                              pRVar5 = local_b8->node->real;
                              fprintf(__s," %.16e %.16e %.16e %d\n",pRVar5[lVar8 * 0xf],
                                      pRVar5[lVar8 * 0xf + 1],pRVar5[lVar8 * 0xf + 2]);
                            }
                            for (local_c0 = 0; local_c0 < face_dict->n; local_c0 = local_c0 + 1) {
                              uVar6 = ref_cell_nodes(pRVar4,face_dict->key[local_c0],nodes);
                              if (uVar6 != 0) {
                                uVar13 = (ulong)uVar6;
                                pcVar10 = "nodes";
                                uVar7 = 0x8af;
                                goto LAB_001b9519;
                              }
                              for (lVar11 = 0; lVar11 < pRVar4->node_per; lVar11 = lVar11 + 1) {
                                uVar6 = ref_dict_location(node_dict,nodes[lVar11],&local);
                                if (uVar6 != 0) {
                                  uVar13 = (ulong)uVar6;
                                  pcVar10 = "ret";
                                  uVar7 = 0x8b1;
                                  goto LAB_001b9519;
                                }
                                fprintf(__s," %d",(ulong)(local + 1));
                              }
                              fputc(10,__s);
                            }
                          }
                          uVar6 = ref_dict_free(face_dict);
                          if (uVar6 == 0) {
                            uVar6 = ref_dict_free(node_dict);
                            if (uVar6 == 0) {
                              uVar6 = ref_dict_create(&node_dict);
                              if (uVar6 == 0) {
                                uVar6 = ref_dict_create(&face_dict);
                                if (uVar6 == 0) {
                                  uVar6 = ref_dict_store(node_dict,local_ac,0);
                                  if (uVar6 == 0) {
                                    lVar8 = 0;
                                    for (lVar11 = 0; lVar11 < ref_cavity->maxseg;
                                        lVar11 = lVar11 + 1) {
                                      if (ref_cavity->s2n[lVar11 * 3] != -1) {
                                        uVar6 = ref_dict_store(face_dict,(REF_INT)lVar11,0);
                                        if (uVar6 != 0) {
                                          uVar13 = (ulong)uVar6;
                                          pcVar10 = "store";
                                          uVar7 = 0x8bf;
                                          goto LAB_001b9519;
                                        }
                                        lVar9 = 0;
                                        while (lVar9 != 2) {
                                          uVar6 = ref_dict_store(node_dict,
                                                                 *(REF_INT *)
                                                                  ((long)ref_cavity->s2n +
                                                                  lVar9 * 4 + lVar8),0);
                                          lVar9 = lVar9 + 1;
                                          if (uVar6 != 0) {
                                            uVar13 = (ulong)uVar6;
                                            pcVar10 = "store";
                                            uVar7 = 0x8c3;
                                            goto LAB_001b9519;
                                          }
                                        }
                                      }
                                      lVar8 = lVar8 + 0xc;
                                    }
                                    if ((0 < node_dict->n) && (0 < face_dict->n)) {
                                      fprintf(__s,
                                              "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                              ,(ulong)(uint)node_dict->n,(ulong)(uint)face_dict->n,
                                              "point","fetriangle");
                                      for (lVar11 = 0; lVar11 < node_dict->n; lVar11 = lVar11 + 1) {
                                        local = node_dict->key[lVar11];
                                        lVar8 = (long)local;
                                        pRVar5 = local_b8->node->real;
                                        fprintf(__s," %.16e %.16e %.16e %d\n",pRVar5[lVar8 * 0xf],
                                                pRVar5[lVar8 * 0xf + 1],pRVar5[lVar8 * 0xf + 2]);
                                      }
                                      for (local_b8 = (REF_GRID)0x0;
                                          (long)local_b8 < (long)face_dict->n;
                                          local_b8 = (REF_GRID)((long)&local_b8->mpi + 1)) {
                                        iVar2 = face_dict->key[(long)local_b8];
                                        uVar6 = ref_dict_location(node_dict,local_ac,&local);
                                        if (uVar6 != 0) {
                                          uVar13 = (ulong)uVar6;
                                          pcVar10 = "center node";
                                          uVar7 = 0x8d7;
                                          goto LAB_001b9519;
                                        }
                                        fprintf(__s," %d",(ulong)(local + 1));
                                        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
                                          uVar6 = ref_dict_location(node_dict,
                                                                    ref_cavity->s2n
                                                                    [iVar2 * 3 + lVar11],&local);
                                          if (uVar6 != 0) {
                                            uVar13 = (ulong)uVar6;
                                            pcVar10 = "ret";
                                            uVar7 = 0x8dc;
                                            goto LAB_001b9519;
                                          }
                                          fprintf(__s," %d",(ulong)(local + 1));
                                        }
                                        fputc(10,__s);
                                      }
                                    }
                                    uVar6 = ref_dict_free(face_dict);
                                    if (uVar6 == 0) {
                                      uVar6 = ref_dict_free(node_dict);
                                      if (uVar6 == 0) {
                                        fclose(__s);
                                        return 0;
                                      }
                                      uVar13 = (ulong)uVar6;
                                      pcVar10 = "free nodes";
                                      uVar7 = 0x8e4;
                                    }
                                    else {
                                      uVar13 = (ulong)uVar6;
                                      pcVar10 = "free face";
                                      uVar7 = 0x8e3;
                                    }
                                  }
                                  else {
                                    uVar13 = (ulong)uVar6;
                                    pcVar10 = "store";
                                    uVar7 = 0x8bd;
                                  }
                                }
                                else {
                                  uVar13 = (ulong)uVar6;
                                  pcVar10 = "create faces";
                                  uVar7 = 0x8bb;
                                }
                              }
                              else {
                                uVar13 = (ulong)uVar6;
                                pcVar10 = "create nodes";
                                uVar7 = 0x8ba;
                              }
                            }
                            else {
                              uVar13 = (ulong)uVar6;
                              pcVar10 = "free nodes";
                              uVar7 = 0x8b8;
                            }
                          }
                          else {
                            uVar13 = (ulong)uVar6;
                            pcVar10 = "free tris";
                            uVar7 = 0x8b7;
                          }
                        }
                        else {
                          uVar13 = (ulong)uVar6;
                          pcVar10 = "create faces";
                          uVar7 = 0x893;
                        }
                      }
                      else {
                        uVar13 = (ulong)uVar6;
                        pcVar10 = "create nodes";
                        uVar7 = 0x892;
                      }
                    }
                    else {
                      uVar13 = (ulong)uVar6;
                      pcVar10 = "free nodes";
                      uVar7 = 0x88e;
                    }
                  }
                  else {
                    uVar13 = (ulong)uVar6;
                    pcVar10 = "free face";
                    uVar7 = 0x88d;
                  }
                }
                else {
                  uVar13 = (ulong)uVar6;
                  pcVar10 = "store";
                  uVar7 = 0x867;
                }
              }
              else {
                uVar13 = (ulong)uVar6;
                pcVar10 = "create faces";
                uVar7 = 0x865;
              }
            }
            else {
              uVar13 = (ulong)uVar6;
              pcVar10 = "create nodes";
              uVar7 = 0x864;
            }
          }
          else {
            uVar13 = (ulong)uVar6;
            pcVar10 = "free nodes";
            uVar7 = 0x862;
          }
        }
        else {
          uVar13 = (ulong)uVar6;
          pcVar10 = "free tris";
          uVar7 = 0x861;
        }
      }
      else {
        uVar13 = (ulong)uVar6;
        pcVar10 = "create faces";
        uVar7 = 0x83d;
      }
    }
    else {
      uVar13 = (ulong)uVar6;
      pcVar10 = "create nodes";
      uVar7 = 0x83c;
    }
LAB_001b9519:
    RVar12 = (REF_STATUS)uVar13;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar7,
           "ref_cavity_tec",uVar13,pcVar10);
  }
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity, const char *filename) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DICT node_dict, face_dict;
  REF_CELL ref_cell;
  REF_INT face, face_node, seg, seg_node;
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local;
  REF_DBL xyz_phys[3];
  const char *zonetype;
  FILE *f;

  zonetype = "fetetrahedron";

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cavity\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"i\"\n");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_f2n(ref_cavity, face_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      face = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_face_node(ref_cavity, face_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_f2n(ref_cavity, face_node, face), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");

  zonetype = "fetriangle";

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_seg(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_s2n(ref_cavity, seg_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      seg = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_seg_node(ref_cavity, seg_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_s2n(ref_cavity, seg_node, seg), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");
  fclose(f);

  return REF_SUCCESS;
}